

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_descriptor_checksum(char *descriptor,char *checksum)

{
  size_t sVar1;
  size_t sVar2;
  ulong local_50;
  size_t idx;
  size_t max;
  size_t pos;
  int iStack_30;
  char ch;
  int j;
  int clscount;
  int cls;
  uint64_t c;
  char *checksum_local;
  char *descriptor_local;
  
  _clscount = 1;
  j = 0;
  iStack_30 = 0;
  sVar1 = strlen(generate_descriptor_checksum::input_charset);
  local_50 = 0;
  while( true ) {
    sVar2 = strlen(descriptor);
    if (sVar2 <= local_50) {
      if (0 < iStack_30) {
        _clscount = poly_mod_descriptor_checksum(_clscount,j);
      }
      for (pos._4_4_ = 0; pos._4_4_ < 8; pos._4_4_ = pos._4_4_ + 1) {
        _clscount = poly_mod_descriptor_checksum(_clscount,0);
      }
      for (pos._4_4_ = 0; pos._4_4_ < 8; pos._4_4_ = pos._4_4_ + 1) {
        checksum[pos._4_4_] =
             generate_descriptor_checksum::checksum_charset
             [(_clscount ^ 1) >> (('\a' - (char)pos._4_4_) * '\x05' & 0x3fU) & 0x1f];
      }
      return 0;
    }
    for (max = 0; (max < sVar1 &&
                  (descriptor[local_50] != generate_descriptor_checksum::input_charset[max]));
        max = max + 1) {
    }
    if (max == sVar1) break;
    _clscount = poly_mod_descriptor_checksum(_clscount,(uint)max & 0x1f);
    j = j * 3 + (int)(max >> 5);
    iStack_30 = iStack_30 + 1;
    if (iStack_30 == 3) {
      _clscount = poly_mod_descriptor_checksum(_clscount,j);
      j = 0;
      iStack_30 = 0;
    }
    local_50 = local_50 + 1;
  }
  return -2;
}

Assistant:

static int generate_descriptor_checksum(const char *descriptor, char *checksum)
{
    /*
     * base:
     * bitcoin/src/script/descriptor.cpp
     * std::string DescriptorChecksum(const Span<const char>& span)
     */

    /** A character set designed such that:
     *  - The most common 'unprotected' descriptor characters (hex, keypaths) are in the first group of 32.
     *  - Case errors cause an offset that's a multiple of 32.
     *  - As many alphabetic characters are in the same group (while following the above restrictions).
     *
     * If p(x) gives the position of a character c in this character set, every group of 3 characters
     * (a,b,c) is encoded as the 4 symbols (p(a) & 31, p(b) & 31, p(c) & 31, (p(a) / 32) + 3 * (p(b) / 32) + 9 * (p(c) / 32).
     * This means that changes that only affect the lower 5 bits of the position, or only the higher 2 bits, will just
     * affect a single symbol.
     *
     * As a result, within-group-of-32 errors count as 1 symbol, as do cross-group errors that don't affect
     * the position within the groups.
     */
    static const char *input_charset =
        "0123456789()[],'/*abcdefgh@:$%{}"
        "IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~"
        "ijklmnopqrstuvwxyzABCDEFGH`#\"\\ ";

    /* The character set for the checksum itself (same as bech32). */
    static const char *checksum_charset =
        "qpzry9x8gf2tvdw0s3jn54khce6mua7l";

    uint64_t c = 1;
    int cls = 0;
    int clscount = 0;
    int j;
    char ch;
    size_t pos;
    size_t max = strlen(input_charset);
    size_t idx;

    for (idx = 0; idx < strlen(descriptor); ++idx) {
        ch = descriptor[idx];
        for (pos = 0; pos < max; ++pos) {
            if (ch == input_charset[pos])
                break;
        }
        if (pos == max)
            return WALLY_EINVAL;
        /* Emit a symbol for the position inside the group, for every character. */
        c = poly_mod_descriptor_checksum(c, pos & 31);
        /* Accumulate the group numbers */
        cls = cls * 3 + (int)(pos >> 5);
        if (++clscount == 3) {
            /* Emit an extra symbol representing the group numbers, for every 3 characters. */
            c = poly_mod_descriptor_checksum(c, cls);
            cls = 0;
            clscount = 0;
        }
    }
    if (clscount > 0)
        c = poly_mod_descriptor_checksum(c, cls);
    for (j = 0; j < 8; ++j)
        c = poly_mod_descriptor_checksum(c, 0);
    c ^= 1;

    for (j = 0; j < DESCRIPTOR_CHECKSUM_LENGTH; ++j)
        checksum[j] = checksum_charset[(c >> (5 * (7 - j))) & 31];

    return WALLY_OK;
}